

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall fizplex::Base::ftran(Base *this,SVector *vec)

{
  bool bVar1;
  type puVar2;
  undefined8 in_RSI;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *in_RDI;
  Nonzero *entry;
  iterator __end1_1;
  iterator __begin1_1;
  SVector *__range1_1;
  ETM *etm;
  iterator __end1;
  iterator __begin1;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *__range1;
  SVector *in_stack_00000060;
  ETM *in_stack_00000068;
  Base *in_stack_00000070;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_40;
  undefined8 local_38;
  reference local_30;
  ETM *local_28;
  __normal_iterator<fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
  local_20 [2];
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (ETM *)std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::begin(in_RDI);
  local_28 = (ETM *)std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::end
                              (in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
               ::operator*(local_20);
    apply_etm(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    __gnu_cxx::
    __normal_iterator<fizplex::Base::ETM_*,_std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>_>
    ::operator++(local_20);
  }
  local_38 = local_10;
  local_40._M_current = (Nonzero *)SVector::begin((SVector *)in_RDI);
  SVector::end((SVector *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
         ::operator*(&local_40);
    puVar2 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                       ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                        in_stack_ffffffffffffffb0,(size_t)in_RDI);
    in_stack_ffffffffffffffb0->index = *puVar2;
    __gnu_cxx::
    __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void Base::ftran(SVector &vec) {
  for (auto &etm : etms)
    apply_etm(etm, vec);

  // Reorder vec according to base column swaps
  for (auto &entry : vec)
    entry.index = row_ordering[entry.index];
}